

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

size_t encode_length(uint8_t *buf,size_t n,size_t prefix)

{
  int iVar1;
  uint8_t *begin;
  size_t k;
  size_t prefix_local;
  size_t n_local;
  uint8_t *buf_local;
  
  iVar1 = (1 << ((byte)prefix & 0x1f)) + -1;
  *buf = *buf & ((byte)iVar1 ^ 0xff);
  if (n < (ulong)(long)iVar1) {
    *buf = *buf | (byte)n;
    buf_local = (uint8_t *)0x1;
  }
  else {
    *buf = *buf | (byte)iVar1;
    n_local = (size_t)(buf + 1);
    for (prefix_local = n - (long)iVar1; 0x7f < prefix_local; prefix_local = prefix_local >> 7) {
      *(byte *)n_local = (byte)prefix_local & 0x7f | 0x80;
      n_local = n_local + 1;
    }
    *(byte *)n_local = (byte)prefix_local;
    buf_local = (uint8_t *)((n_local + 1) - (long)buf);
  }
  return (size_t)buf_local;
}

Assistant:

static size_t encode_length(uint8_t *buf, size_t n, size_t prefix) {
  size_t k = (size_t)((1 << prefix) - 1);
  uint8_t *begin = buf;

  *buf = (uint8_t)(*buf & ~k);

  if (n < k) {
    *buf = (uint8_t)(*buf | n);
    return 1;
  }

  *buf = (uint8_t)(*buf | k);
  ++buf;

  n -= k;

  for (; n >= 128; n >>= 7) {
    *buf++ = (uint8_t)((1 << 7) | (n & 0x7f));
  }

  *buf++ = (uint8_t)n;

  return (size_t)(buf - begin);
}